

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O3

int dlep_writer_map_l2neigh_data
              (dlep_writer *writer,dlep_extension *ext,oonf_layer2_data *data,oonf_layer2_data *def)

{
  oonf_layer2_data *poVar1;
  oonf_layer2_neighbor_index idx;
  dlep_neighbor_mapping *pdVar2;
  code *pcVar3;
  int iVar4;
  oonf_layer2_metadata *poVar5;
  ulong uVar6;
  oonf_layer2_data *poVar7;
  long lVar8;
  bool bVar9;
  
  if (ext->neigh_mapping_count != 0) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      pdVar2 = ext->neigh_mapping;
      idx = *(oonf_layer2_neighbor_index *)((long)&pdVar2->layer2 + lVar8);
      poVar1 = data + idx;
      if (poVar1->_origin == (oonf_layer2_origin *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = poVar1->_meta != (oonf_layer2_metadata *)0x0;
      }
      poVar7 = poVar1;
      if (!bVar9) {
        poVar7 = def + idx;
      }
      if (def == (oonf_layer2_data *)0x0) {
        poVar7 = poVar1;
      }
      pcVar3 = *(code **)((long)&pdVar2->to_tlv + lVar8);
      poVar5 = oonf_layer2_neigh_metadata_get(idx);
      iVar4 = (*pcVar3)(writer,poVar7,poVar5,*(undefined2 *)((long)&pdVar2->dlep + lVar8),
                        *(undefined2 *)((long)&pdVar2->length + lVar8),
                        *(undefined8 *)((long)&pdVar2->scaling + lVar8));
      if (iVar4 != 0) {
        return ~(uint)uVar6;
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x40;
    } while (uVar6 < ext->neigh_mapping_count);
  }
  return 0;
}

Assistant:

int
dlep_writer_map_l2neigh_data(
  struct dlep_writer *writer, struct dlep_extension *ext, struct oonf_layer2_data *data, struct oonf_layer2_data *def) {
  struct dlep_neighbor_mapping *map;
  struct oonf_layer2_data *ptr;
  size_t i;

  for (i = 0; i < ext->neigh_mapping_count; i++) {
    map = &ext->neigh_mapping[i];

    ptr = &data[map->layer2];
    if (!oonf_layer2_data_has_value(ptr) && def) {
      ptr = &def[map->layer2];
    }

    if (map->to_tlv(writer, ptr, oonf_layer2_neigh_metadata_get(map->layer2), map->dlep, map->length, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}